

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O0

void __thiscall bf_crc::print_settings(bf_crc *this)

{
  uint32_t uVar1;
  ostream *poVar2;
  ostream *this_00;
  ushort *in_RDI;
  bool v;
  undefined8 in_stack_ffffffffffffff70;
  FEED_TYPE feed_type;
  bf_crc *in_stack_ffffffffffffff78;
  string local_78 [32];
  string local_58 [48];
  string local_28 [40];
  
  feed_type = (FEED_TYPE)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  poVar2 = std::operator<<((ostream *)&std::cout,"Brute Force CRC Settings");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"CRC Width\t\t: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*in_RDI);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Truncated Polynomial\t");
  if (*(int *)(in_RDI + 2) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,": 0x0 to 0x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(1 << ((byte)*in_RDI & 0x1f)) + -1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,": 0x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(in_RDI + 2));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"Truncated Polynomial\t");
  if (*(int *)(in_RDI + 2) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,": 0x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(in_RDI + 6));
    poVar2 = std::operator<<(poVar2," to 0x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(in_RDI + 8));
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,": 0x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(in_RDI + 2));
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if ((in_RDI[0xe] & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Initial value\t\t: 0x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(in_RDI + 0x10));
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Initial value\t\t: 0x0 to 0x");
    in_stack_ffffffffffffff78 = (bf_crc *)std::ostream::operator<<(poVar2,std::hex);
    uVar1 = max_value((uint8_t)*in_RDI);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)in_stack_ffffffffffffff78,uVar1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if ((in_RDI[10] & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"final xor\t\t: 0x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(in_RDI + 0xc));
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Final xor\t\t: 0x0 to 0x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    uVar1 = max_value((uint8_t)*in_RDI);
    this_00 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    feed_type = (FEED_TYPE)((ulong)poVar2 >> 0x20);
    poVar2 = (ostream *)std::ostream::operator<<(this_00,std::dec);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Probe reflect in\t: ");
  v = SUB81((ulong)poVar2 >> 0x38,0);
  bool_to_str_abi_cxx11_(v);
  poVar2 = std::operator<<(poVar2,local_28);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_28);
  poVar2 = std::operator<<((ostream *)&std::cout,"Probe reflect out\t: ");
  bool_to_str_abi_cxx11_(v);
  poVar2 = std::operator<<(poVar2,local_58);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_58);
  poVar2 = std::operator<<((ostream *)&std::cout,"Feed type               : ");
  feed_type_to_str_abi_cxx11_(in_stack_ffffffffffffff78,feed_type);
  poVar2 = std::operator<<(poVar2,local_78);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_78);
  poVar2 = std::operator<<((ostream *)&std::cout,"Permutation count\t: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ulong *)(in_RDI + 0x18));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void bf_crc::print_settings(void)
{

  // Output Brute Force Settings
  std::cout << "Brute Force CRC Settings" << std::endl;
  std::cout << "------------------------" << std::endl;

  std::cout << "CRC Width		: " << crc_width_ << std::endl;

  std::cout << "Truncated Polynomial	";
  if (polynomial_ > 0)
    std::cout << ": 0x" << std::hex << polynomial_ << std::endl;
  else
    std::cout << ": 0x0 to 0x" << std::hex << MAX_VALUE(crc_width_) << std::endl;


  std::cout << "Truncated Polynomial	";
	if (polynomial_ > 0)
		std::cout << ": 0x" << std::hex << polynomial_ << std::dec << std::endl;
	else
		std::cout << ": 0x" << std::hex << polynomial_start_ << " to 0x" << std::hex << polynomial_end_ << std::dec << std::endl;

	if (probe_initial_)
		std::cout << "Initial value		: 0x0 to 0x" << std::hex << max_value(crc_width_) << std::dec << std::endl;
	else
		std::cout << "Initial value		: 0x" << std::hex << initial_ << std::dec << std::endl;

	if (probe_final_xor_)
		std::cout << "Final xor		: 0x0 to 0x" << std::hex << max_value(crc_width_) << std::dec << std::endl;
	else
		std::cout << "final xor		: 0x" <<std::hex << final_xor_ << std::dec << std::endl;

	std::cout << "Probe reflect in	: " << bool_to_str(probe_reflected_input_) << std::endl;
	std::cout << "Probe reflect out	: " << bool_to_str(probe_reflected_output_) << std::endl;
	std::cout << "Feed type               : " << feed_type_to_str(feed_type_) << std::endl;

	std::cout << "Permutation count	: " << test_vector_count_ << std::endl;
	std::cout << std::endl << std::flush;	
}